

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_trotter.cpp
# Opt level: O0

void trotter<std::complex<double>>
               (QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *circuit)

{
  R RVar1;
  __type _Var2;
  uint local_11c;
  int local_10c;
  unique_ptr<qclab::qgates::RotationX<std::complex<double>_>,_std::default_delete<qclab::qgates::RotationX<std::complex<double>_>_>_>
  local_108;
  unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
  local_100;
  double local_f8;
  unique_ptr<qclab::qgates::RotationX<std::complex<double>_>,_std::default_delete<qclab::qgates::RotationX<std::complex<double>_>_>_>
  local_f0;
  unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
  local_e8;
  int local_dc;
  unique_ptr<qclab::qgates::CX<std::complex<double>_>,_std::default_delete<qclab::qgates::CX<std::complex<double>_>_>_>
  local_d8;
  unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
  local_d0;
  int local_c4;
  unique_ptr<qclab::qgates::RotationZ<std::complex<double>_>,_std::default_delete<qclab::qgates::RotationZ<std::complex<double>_>_>_>
  local_c0;
  unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
  local_b8;
  unique_ptr<qclab::qgates::RotationX<std::complex<double>_>,_std::default_delete<qclab::qgates::RotationX<std::complex<double>_>_>_>
  local_b0;
  unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
  local_a8;
  int local_9c;
  unique_ptr<qclab::qgates::CX<std::complex<double>_>,_std::default_delete<qclab::qgates::CX<std::complex<double>_>_>_>
  local_98;
  unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
  local_90;
  double local_88;
  int local_7c;
  unique_ptr<qclab::qgates::RotationX<std::complex<double>_>,_std::default_delete<qclab::qgates::RotationX<std::complex<double>_>_>_>
  local_78;
  unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
  local_70;
  double local_68;
  unique_ptr<qclab::qgates::RotationX<std::complex<double>_>,_std::default_delete<qclab::qgates::RotationX<std::complex<double>_>_>_>
  local_60;
  unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
  local_58;
  double local_50;
  int i_1;
  unique_ptr<qclab::qgates::RotationZ<std::complex<double>_>,_std::default_delete<qclab::qgates::RotationZ<std::complex<double>_>_>_>
  local_40;
  unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
  local_38;
  uint local_2c;
  uint local_28;
  int i;
  int os_c;
  int os;
  int lyr;
  int n;
  R pi;
  QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *circuit_local;
  
  pi = (R)circuit;
  _Var2 = std::atan<int>(1);
  _lyr = _Var2 * 4.0;
  os = (*(code *)**(undefined8 **)pi)();
  for (os_c = 0; os_c < os; os_c = os_c + 1) {
    local_2c = (uint)(os_c % 2 != 0);
    local_11c = local_2c;
    if (os % 2 != 0) {
      local_11c = 1 - local_2c;
    }
    local_28 = local_11c;
    i = local_2c;
    for (; RVar1 = pi, (int)local_2c < (int)(os - local_28); local_2c = local_2c + 1) {
      std::make_unique<qclab::qgates::RotationZ<std::complex<double>>,int&,double_const&>
                ((int *)&local_40,(double *)&local_2c);
      std::
      unique_ptr<qclab::QObject<std::complex<double>>,std::default_delete<qclab::QObject<std::complex<double>>>>
      ::
      unique_ptr<qclab::qgates::RotationZ<std::complex<double>>,std::default_delete<qclab::qgates::RotationZ<std::complex<double>>>,void>
                ((unique_ptr<qclab::QObject<std::complex<double>>,std::default_delete<qclab::QObject<std::complex<double>>>>
                  *)&local_38,&local_40);
      qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::push_back
                ((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)RVar1,
                 &local_38);
      std::
      unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
      ::~unique_ptr(&local_38);
      std::
      unique_ptr<qclab::qgates::RotationZ<std::complex<double>_>,_std::default_delete<qclab::qgates::RotationZ<std::complex<double>_>_>_>
      ::~unique_ptr(&local_40);
    }
    for (local_50._0_4_ = i; RVar1 = pi, local_50._0_4_ < (int)((os - local_28) + -1);
        local_50._0_4_ = local_50._0_4_ + 2) {
      local_68 = _lyr * 0.5;
      std::make_unique<qclab::qgates::RotationX<std::complex<double>>,int&,double>
                ((int *)&local_60,&local_50);
      std::
      unique_ptr<qclab::QObject<std::complex<double>>,std::default_delete<qclab::QObject<std::complex<double>>>>
      ::
      unique_ptr<qclab::qgates::RotationX<std::complex<double>>,std::default_delete<qclab::qgates::RotationX<std::complex<double>>>,void>
                ((unique_ptr<qclab::QObject<std::complex<double>>,std::default_delete<qclab::QObject<std::complex<double>>>>
                  *)&local_58,&local_60);
      qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::push_back
                ((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)RVar1,
                 &local_58);
      std::
      unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
      ::~unique_ptr(&local_58);
      std::
      unique_ptr<qclab::qgates::RotationX<std::complex<double>_>,_std::default_delete<qclab::qgates::RotationX<std::complex<double>_>_>_>
      ::~unique_ptr(&local_60);
      RVar1 = pi;
      local_7c = local_50._0_4_ + 1;
      local_88 = _lyr * 0.5;
      std::make_unique<qclab::qgates::RotationX<std::complex<double>>,int,double>
                ((int *)&local_78,(double *)&local_7c);
      std::
      unique_ptr<qclab::QObject<std::complex<double>>,std::default_delete<qclab::QObject<std::complex<double>>>>
      ::
      unique_ptr<qclab::qgates::RotationX<std::complex<double>>,std::default_delete<qclab::qgates::RotationX<std::complex<double>>>,void>
                ((unique_ptr<qclab::QObject<std::complex<double>>,std::default_delete<qclab::QObject<std::complex<double>>>>
                  *)&local_70,&local_78);
      qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::push_back
                ((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)RVar1,
                 &local_70);
      std::
      unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
      ::~unique_ptr(&local_70);
      std::
      unique_ptr<qclab::qgates::RotationX<std::complex<double>_>,_std::default_delete<qclab::qgates::RotationX<std::complex<double>_>_>_>
      ::~unique_ptr(&local_78);
      RVar1 = pi;
      local_9c = local_50._0_4_ + 1;
      std::make_unique<qclab::qgates::CX<std::complex<double>>,int&,int>
                ((int *)&local_98,(int *)&local_50);
      std::
      unique_ptr<qclab::QObject<std::complex<double>>,std::default_delete<qclab::QObject<std::complex<double>>>>
      ::
      unique_ptr<qclab::qgates::CX<std::complex<double>>,std::default_delete<qclab::qgates::CX<std::complex<double>>>,void>
                ((unique_ptr<qclab::QObject<std::complex<double>>,std::default_delete<qclab::QObject<std::complex<double>>>>
                  *)&local_90,&local_98);
      qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::push_back
                ((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)RVar1,
                 &local_90);
      std::
      unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
      ::~unique_ptr(&local_90);
      std::
      unique_ptr<qclab::qgates::CX<std::complex<double>_>,_std::default_delete<qclab::qgates::CX<std::complex<double>_>_>_>
      ::~unique_ptr(&local_98);
      RVar1 = pi;
      std::make_unique<qclab::qgates::RotationX<std::complex<double>>,int&,double_const&>
                ((int *)&local_b0,&local_50);
      std::
      unique_ptr<qclab::QObject<std::complex<double>>,std::default_delete<qclab::QObject<std::complex<double>>>>
      ::
      unique_ptr<qclab::qgates::RotationX<std::complex<double>>,std::default_delete<qclab::qgates::RotationX<std::complex<double>>>,void>
                ((unique_ptr<qclab::QObject<std::complex<double>>,std::default_delete<qclab::QObject<std::complex<double>>>>
                  *)&local_a8,&local_b0);
      qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::push_back
                ((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)RVar1,
                 &local_a8);
      std::
      unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
      ::~unique_ptr(&local_a8);
      std::
      unique_ptr<qclab::qgates::RotationX<std::complex<double>_>,_std::default_delete<qclab::qgates::RotationX<std::complex<double>_>_>_>
      ::~unique_ptr(&local_b0);
      RVar1 = pi;
      local_c4 = local_50._0_4_ + 1;
      std::make_unique<qclab::qgates::RotationZ<std::complex<double>>,int,double_const&>
                ((int *)&local_c0,(double *)&local_c4);
      std::
      unique_ptr<qclab::QObject<std::complex<double>>,std::default_delete<qclab::QObject<std::complex<double>>>>
      ::
      unique_ptr<qclab::qgates::RotationZ<std::complex<double>>,std::default_delete<qclab::qgates::RotationZ<std::complex<double>>>,void>
                ((unique_ptr<qclab::QObject<std::complex<double>>,std::default_delete<qclab::QObject<std::complex<double>>>>
                  *)&local_b8,&local_c0);
      qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::push_back
                ((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)RVar1,
                 &local_b8);
      std::
      unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
      ::~unique_ptr(&local_b8);
      std::
      unique_ptr<qclab::qgates::RotationZ<std::complex<double>_>,_std::default_delete<qclab::qgates::RotationZ<std::complex<double>_>_>_>
      ::~unique_ptr(&local_c0);
      RVar1 = pi;
      local_dc = local_50._0_4_ + 1;
      std::make_unique<qclab::qgates::CX<std::complex<double>>,int&,int>
                ((int *)&local_d8,(int *)&local_50);
      std::
      unique_ptr<qclab::QObject<std::complex<double>>,std::default_delete<qclab::QObject<std::complex<double>>>>
      ::
      unique_ptr<qclab::qgates::CX<std::complex<double>>,std::default_delete<qclab::qgates::CX<std::complex<double>>>,void>
                ((unique_ptr<qclab::QObject<std::complex<double>>,std::default_delete<qclab::QObject<std::complex<double>>>>
                  *)&local_d0,&local_d8);
      qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::push_back
                ((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)RVar1,
                 &local_d0);
      std::
      unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
      ::~unique_ptr(&local_d0);
      std::
      unique_ptr<qclab::qgates::CX<std::complex<double>_>,_std::default_delete<qclab::qgates::CX<std::complex<double>_>_>_>
      ::~unique_ptr(&local_d8);
      RVar1 = pi;
      local_f8 = _lyr * -0.5;
      std::make_unique<qclab::qgates::RotationX<std::complex<double>>,int&,double>
                ((int *)&local_f0,&local_50);
      std::
      unique_ptr<qclab::QObject<std::complex<double>>,std::default_delete<qclab::QObject<std::complex<double>>>>
      ::
      unique_ptr<qclab::qgates::RotationX<std::complex<double>>,std::default_delete<qclab::qgates::RotationX<std::complex<double>>>,void>
                ((unique_ptr<qclab::QObject<std::complex<double>>,std::default_delete<qclab::QObject<std::complex<double>>>>
                  *)&local_e8,&local_f0);
      qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::push_back
                ((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)RVar1,
                 &local_e8);
      std::
      unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
      ::~unique_ptr(&local_e8);
      std::
      unique_ptr<qclab::qgates::RotationX<std::complex<double>_>,_std::default_delete<qclab::qgates::RotationX<std::complex<double>_>_>_>
      ::~unique_ptr(&local_f0);
      RVar1 = pi;
      local_10c = local_50._0_4_ + 1;
      std::make_unique<qclab::qgates::RotationX<std::complex<double>>,int,double>
                ((int *)&local_108,(double *)&local_10c);
      std::
      unique_ptr<qclab::QObject<std::complex<double>>,std::default_delete<qclab::QObject<std::complex<double>>>>
      ::
      unique_ptr<qclab::qgates::RotationX<std::complex<double>>,std::default_delete<qclab::qgates::RotationX<std::complex<double>>>,void>
                ((unique_ptr<qclab::QObject<std::complex<double>>,std::default_delete<qclab::QObject<std::complex<double>>>>
                  *)&local_100,&local_108);
      qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::push_back
                ((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)RVar1,
                 &local_100);
      std::
      unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
      ::~unique_ptr(&local_100);
      std::
      unique_ptr<qclab::qgates::RotationX<std::complex<double>_>,_std::default_delete<qclab::qgates::RotationX<std::complex<double>_>_>_>
      ::~unique_ptr(&local_108);
    }
  }
  return;
}

Assistant:

void trotter( qclab::QCircuit< T >& circuit ) {

  using R  = qclab::real_t< T > ;
  using RX = qclab::qgates::RotationX< T > ;
  using RZ = qclab::qgates::RotationZ< T > ;
  using CX = qclab::qgates::CNOT< T > ;

  // constants
  const R pi = 4 * std::atan(1) ;
  const int n = circuit.nbQubits() ;

  // layers
  for ( int lyr = 0; lyr < n; lyr++ ) {
    int os = ( lyr % 2 ) ? 1 : 0 ;        // offset at bottom
    int os_c = ( n % 2 ) ? 1 - os : os ;  // offset at top
    for ( int i = os; i < n - os_c; i++ ) {
      circuit.push_back( std::make_unique< RZ >( i , pi ) ) ;
    }
    for ( int i = os; i < n - os_c - 1; i += 2 ) {
      circuit.push_back( std::make_unique< RX >( i     , pi/2 ) ) ;
      circuit.push_back( std::make_unique< RX >( i + 1 , pi/2 ) ) ;
      circuit.push_back( std::make_unique< CX >( i , i + 1 ) ) ;
      circuit.push_back( std::make_unique< RX >( i     , pi ) ) ;
      circuit.push_back( std::make_unique< RZ >( i + 1 , pi ) ) ;
      circuit.push_back( std::make_unique< CX >( i , i + 1 ) ) ;
      circuit.push_back( std::make_unique< RX >( i     , -pi/2 ) ) ;
      circuit.push_back( std::make_unique< RX >( i + 1 , -pi/2 ) ) ;
    }
  }

}